

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *fp;
  EVP_PKEY *pkey;
  int *piVar5;
  char *pcVar6;
  sockaddr_storage *__addr;
  char *pcVar7;
  char *local_1e8;
  quicly_stream_t *stream;
  quicly_conn_t *client;
  char acStack_1d0 [16];
  sockaddr *psStack_1c0;
  char *local_1b8;
  addrinfo *paStack_1b0;
  quicly_stream_open_t stream_open;
  ptls_openssl_sign_certificate_t sign_certificate;
  ptls_context_t tlsctx;
  sockaddr_storage sa;
  
  memcpy(&tlsctx,&PTR_ptls_openssl_random_bytes_00133590,0xb8);
  stream_open.cb = on_stream_open;
  memcpy(&ctx,&quicly_spec_context,0x100);
  ctx.tls = &tlsctx;
  quicly_amend_ptls_context(&tlsctx);
  local_1e8 = "4433";
  ctx.stream_open = &stream_open;
LAB_001133a1:
  do {
    while (iVar2 = getopt(argc,argv,"c:k:p:h"), iVar2 == 99) {
      uVar4 = ptls_load_certificates(&tlsctx,_optarg);
      if (uVar4 != 0) {
        fprintf(_stderr,"failed to load certificates from file %s:%d\n",_optarg,(ulong)uVar4);
LAB_00113682:
        exit(1);
      }
    }
    if (iVar2 == 0x6b) {
      fp = fopen(_optarg,"r");
      pFVar1 = _stderr;
      pcVar7 = _optarg;
      if (fp == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"failed to open file:%s:%s\n",pcVar7,pcVar6);
        goto LAB_00113682;
      }
      pkey = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      fclose(fp);
      if (pkey == (EVP_PKEY *)0x0) {
        fprintf(_stderr,"failed to load private key from file:%s\n",_optarg);
        goto LAB_00113682;
      }
      ptls_openssl_init_sign_certificate(&sign_certificate,(EVP_PKEY *)pkey);
      EVP_PKEY_free(pkey);
      tlsctx.sign_certificate = &sign_certificate.super;
      goto LAB_001133a1;
    }
    if (iVar2 == -1) {
      if ((tlsctx.sign_certificate == (ptls_sign_certificate_t *)0x0) ==
          (tlsctx.certificates.count != 0)) {
        fwrite("-c and -k options must be used together\n",0x28,1,_stderr);
        goto LAB_00113682;
      }
      if (_optind == argc) {
        pcVar7 = "127.0.0.1";
      }
      else {
        pcVar7 = argv[_optind];
      }
      acStack_1d0[8] = '\0';
      acStack_1d0[9] = '\0';
      acStack_1d0[10] = '\0';
      acStack_1d0[0xb] = '\0';
      acStack_1d0[0xc] = '\0';
      acStack_1d0[0xd] = '\0';
      acStack_1d0[0xe] = '\0';
      acStack_1d0[0xf] = '\0';
      psStack_1c0 = (sockaddr *)0x0;
      local_1b8 = (char *)0x0;
      paStack_1b0 = (addrinfo *)0x0;
      client = (quicly_conn_t *)0x200000421;
      acStack_1d0[0] = '\x02';
      acStack_1d0[1] = '\0';
      acStack_1d0[2] = '\0';
      acStack_1d0[3] = '\0';
      acStack_1d0[4] = '\0';
      acStack_1d0[5] = '\0';
      acStack_1d0[6] = '\0';
      acStack_1d0[7] = '\0';
      iVar2 = getaddrinfo(pcVar7,local_1e8,(addrinfo *)&client,(addrinfo **)&stream);
      pFVar1 = _stderr;
      if ((iVar2 != 0) || (stream == (quicly_stream_t *)0x0)) {
        if (iVar2 == 0) {
          pcVar6 = "getaddrinfo returned NULL";
        }
        else {
          pcVar6 = gai_strerror(iVar2);
        }
        fprintf(pFVar1,"failed to resolve address:%s:%s:%s\n",pcVar7,local_1e8,pcVar6);
        goto LAB_00113682;
      }
      uVar4 = *(uint *)&stream->callbacks;
      memcpy(&sa,(stream->sendstate).acked.ranges,(ulong)uVar4);
      freeaddrinfo((addrinfo *)stream);
      iVar2 = socket((uint)sa.ss_family,2,0);
      if (iVar2 == -1) {
        pcVar7 = "socket(2) failed";
      }
      else {
        if (((ctx.tls)->certificates).count == 0) {
          __addr = (sockaddr_storage *)&client;
          client = (quicly_conn_t *)0x0;
          acStack_1d0[0] = '\0';
          acStack_1d0[1] = '\0';
          acStack_1d0[2] = '\0';
          acStack_1d0[3] = '\0';
          acStack_1d0[4] = '\0';
          acStack_1d0[5] = '\0';
          acStack_1d0[6] = '\0';
          acStack_1d0[7] = '\0';
          uVar4 = 0x10;
        }
        else {
          client = (quicly_conn_t *)CONCAT44(client._4_4_,1);
          setsockopt(iVar2,1,2,&client,4);
          __addr = &sa;
        }
        iVar3 = bind(iVar2,(sockaddr *)__addr,uVar4);
        if (iVar3 == 0) {
          client = (quicly_conn_t *)0x0;
          if (((ctx.tls)->certificates).count == 0) {
            uVar4 = quicly_connect(&client,&ctx,pcVar7,(sockaddr *)&sa,(sockaddr *)0x0,&next_cid,
                                   (ptls_iovec_t)ZEXT816(0),(ptls_handshake_properties_t *)0x0,
                                   (quicly_transport_parameters_t *)0x0);
            if (uVar4 != 0) {
              fprintf(_stderr,"quicly_connect failed:%d\n",(ulong)uVar4);
              goto LAB_00113682;
            }
            quicly_open_stream(client,&stream,0);
          }
          iVar2 = run_loop(iVar2,client);
          return iVar2;
        }
        pcVar7 = "bind(2) failed";
      }
      perror(pcVar7);
      goto LAB_00113682;
    }
    if (iVar2 != 0x70) {
      if (iVar2 == 0x68) {
        printf("Usage: %s [options] [host]\nOptions:\n  -c <file>    specifies the certificate chain file (PEM format)\n  -k <file>    specifies the private key file (PEM format)\n  -p <number>  specifies the port number (default: 4433)\n  -h           prints this help\n\nWhen both `-c` and `-k` is specified, runs as a server.  Otherwise, runs as a\nclient connecting to host:port.  If omitted, host defaults to 127.0.0.1.\n"
               ,*argv);
        exit(0);
      }
      goto LAB_00113682;
    }
    local_1e8 = _optarg;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t sign_certificate;
    ptls_context_t tlsctx = {
        .random_bytes = ptls_openssl_random_bytes,
        .get_time = &ptls_get_time,
        .key_exchanges = ptls_openssl_key_exchanges,
        .cipher_suites = ptls_openssl_cipher_suites,
    };
    quicly_stream_open_t stream_open = {on_stream_open};
    char *host = "127.0.0.1", *port = "4433";
    struct sockaddr_storage sa;
    socklen_t salen;
    int ch, fd;

    /* setup quic context */
    ctx = quicly_spec_context;
    ctx.tls = &tlsctx;
    quicly_amend_ptls_context(ctx.tls);
    ctx.stream_open = &stream_open;

    /* resolve command line options and arguments */
    while ((ch = getopt(argc, argv, "c:k:p:h")) != -1) {
        switch (ch) {
        case 'c': /* load certificate chain */ {
            int ret;
            if ((ret = ptls_load_certificates(&tlsctx, optarg)) != 0) {
                fprintf(stderr, "failed to load certificates from file %s:%d\n", optarg, ret);
                exit(1);
            }
        } break;
        case 'k': /* load private key */ {
            FILE *fp;
            if ((fp = fopen(optarg, "r")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            EVP_PKEY *pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                exit(1);
            }
            ptls_openssl_init_sign_certificate(&sign_certificate, pkey);
            EVP_PKEY_free(pkey);
            tlsctx.sign_certificate = &sign_certificate.super;
        } break;
        case 'p': /* port */
            port = optarg;
            break;
        case 'h': /* help */
            usage(argv[0]);
            break;
        default:
            exit(1);
            break;
        }
    }
    if ((tlsctx.certificates.count != 0) != (tlsctx.sign_certificate != NULL)) {
        fprintf(stderr, "-c and -k options must be used together\n");
        exit(1);
    }
    argc -= optind;
    argv += optind;
    if (argc != 0)
        host = *argv++;
    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, AF_INET, SOCK_DGRAM, 0) != 0)
        exit(1);

    /* open socket, on the specified port (as a server), or on any port (as a client) */
    if ((fd = socket(sa.ss_family, SOCK_DGRAM, 0)) == -1) {
        perror("socket(2) failed");
        exit(1);
    }
    // fcntl(fd, F_SETFL, O_NONBLOCK);
    if (is_server()) {
        int reuseaddr = 1;
        setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &reuseaddr, sizeof(reuseaddr));
        if (bind(fd, (struct sockaddr *)&sa, salen) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    } else {
        struct sockaddr_in local;
        memset(&local, 0, sizeof(local));
        if (bind(fd, (struct sockaddr *)&local, sizeof(local)) != 0) {
            perror("bind(2) failed");
            exit(1);
        }
    }

    quicly_conn_t *client = NULL;
    if (!is_server()) {
        /* initiate a connection, and open a stream */
        int ret;
        if ((ret = quicly_connect(&client, &ctx, host, (struct sockaddr *)&sa, NULL, &next_cid, ptls_iovec_init(NULL, 0), NULL,
                                  NULL)) != 0) {
            fprintf(stderr, "quicly_connect failed:%d\n", ret);
            exit(1);
        }
        quicly_stream_t *stream; /* we retain the opened stream via the on_stream_open callback */
        quicly_open_stream(client, &stream, 0);
    }

    /* enter the event loop with a connection object */
    return run_loop(fd, client);
}